

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

void cmQtAutoGen::UicMergeOptions
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *baseOpts,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *newOpts,bool isQt5)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_113;
  undefined1 local_112;
  allocator<char> local_111;
  allocator<char> local_110;
  allocator<char> local_10f;
  allocator<char> local_10e;
  allocator<char> local_10d [20];
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  undefined8 uStack_18;
  bool isQt5_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *newOpts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *baseOpts_local;
  
  local_19 = isQt5;
  uStack_18 = newOpts;
  newOpts_local = baseOpts;
  if (UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
      ::valueOpts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                 ::valueOpts_abi_cxx11_);
    if (iVar1 != 0) {
      local_112 = 1;
      local_f8 = &local_f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"tr",&local_f9);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d0,"translate",local_10d);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"postfix",&local_10e);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_90,"generator",&local_10f);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"include",&local_110);
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_50,"g",&local_111);
      local_112 = 0;
      local_30 = &local_f0;
      local_28 = 6;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_113);
      __l._M_len = local_28;
      __l._M_array = local_30;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                ::valueOpts_abi_cxx11_,__l,&local_113);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_113);
      local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
      do {
        local_188 = local_188 + -1;
        std::__cxx11::string::~string((string *)local_188);
      } while (local_188 != &local_f0);
      std::allocator<char>::~allocator(&local_111);
      std::allocator<char>::~allocator(&local_110);
      std::allocator<char>::~allocator(&local_10f);
      std::allocator<char>::~allocator(&local_10e);
      std::allocator<char>::~allocator(local_10d);
      std::allocator<char>::~allocator(&local_f9);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                    ::valueOpts_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                           ::valueOpts_abi_cxx11_);
    }
  }
  MergeOptions(newOpts_local,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)uStack_18,
               &UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                ::valueOpts_abi_cxx11_,(bool)(local_19 & 1));
  return;
}

Assistant:

void cmQtAutoGen::UicMergeOptions(std::vector<std::string>& baseOpts,
                                  std::vector<std::string> const& newOpts,
                                  bool isQt5)
{
  static std::vector<std::string> const valueOpts = {
    "tr",      "translate", "postfix", "generator",
    "include", // Since Qt 5.3
    "g"
  };
  MergeOptions(baseOpts, newOpts, valueOpts, isQt5);
}